

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildTypeManager(IRContext *this)

{
  Analysis AVar1;
  MessageConsumer *args;
  IRContext *local_20;
  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_10 = this;
  args = consumer(this);
  local_20 = this;
  MakeUnique<spvtools::opt::analysis::TypeManager,std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>const&,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,args,&local_20);
  std::
  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ::operator=(&this->type_mgr_,&local_18);
  std::
  unique_ptr<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ::~unique_ptr(&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisTypes);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildTypeManager() {
    type_mgr_ = MakeUnique<analysis::TypeManager>(consumer(), this);
    valid_analyses_ = valid_analyses_ | kAnalysisTypes;
  }